

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O3

void __thiscall
lunasvg::SVGGeometryElement::layoutElement(SVGGeometryElement *this,SVGLayoutState *state)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pSVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  SVGPaintServer SVar4;
  StrokeData local_48;
  
  this->m_fill_rule = state->m_fill_rule;
  this->m_clip_rule = state->m_clip_rule;
  SVar4 = SVGGraphicsElement::getPaintServer
                    (&this->super_SVGGraphicsElement,&state->m_fill,state->m_fill_opacity);
  this->m_fill = SVar4;
  SVar4 = SVGGraphicsElement::getPaintServer
                    (&this->super_SVGGraphicsElement,&state->m_stroke,state->m_stroke_opacity);
  this->m_stroke = SVar4;
  SVGGraphicsElement::getStrokeData(&local_48,&this->super_SVGGraphicsElement,state);
  *(ulong *)((long)&(this->m_strokeData).m_miterLimit + 2) =
       CONCAT62(local_48._8_6_,local_48.m_miterLimit._2_2_);
  (this->m_strokeData).m_lineWidth = (float)local_48.m_lineWidth;
  (this->m_strokeData).m_miterLimit =
       (float)(int)(CONCAT26(local_48.m_miterLimit._2_2_,local_48._0_6_) >> 0x20);
  pfVar1 = (this->m_strokeData).m_dashArray.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->m_strokeData).m_dashArray.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_strokeData).m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_strokeData).m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_strokeData).m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1,(long)pfVar2 - (long)pfVar1);
    if (local_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  SVGElement::layoutElement((SVGElement *)this,state);
  Path::reset(&this->m_path);
  pSVar3 = (this->m_markerPositions).
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_markerPositions).
      super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar3) {
    (this->m_markerPositions).
    super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar3;
  }
  (*(this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode[0x12])
            (this,&this->m_path);
  (this->m_fillBoundingBox).x = extraout_XMM0_Da;
  (this->m_fillBoundingBox).y = extraout_XMM0_Db;
  (this->m_fillBoundingBox).w = (float)in_XMM1_Qa;
  (this->m_fillBoundingBox).h = (float)((ulong)in_XMM1_Qa >> 0x20);
  updateMarkerPositions(this,&this->m_markerPositions,state);
  return;
}

Assistant:

void SVGGeometryElement::layoutElement(const SVGLayoutState& state)
{
    m_fill_rule = state.fill_rule();
    m_clip_rule = state.clip_rule();
    m_fill = getPaintServer(state.fill(), state.fill_opacity());
    m_stroke = getPaintServer(state.stroke(), state.stroke_opacity());
    m_strokeData = getStrokeData(state);
    SVGGraphicsElement::layoutElement(state);

    m_path.reset();
    m_markerPositions.clear();
    m_fillBoundingBox = updateShape(m_path);
    updateMarkerPositions(m_markerPositions, state);
}